

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceAccessChainWith
          (InterfaceVariableScalarReplacement *this,Instruction *access_chain,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          Instruction *scalar_var,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_component_values)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  uint32_t i;
  uint32_t index;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index = 1;
  while( true ) {
    uVar1 = Instruction::NumInOperands(access_chain);
    if (uVar1 <= index) break;
    uVar1 = Instruction::GetSingleWordInOperand(access_chain,index);
    local_68._0_4_ = uVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&indexes,(uint *)local_68._M_pod_data);
    index = index + 1;
  }
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x30);
  *(InterfaceVariableScalarReplacement **)local_68._M_unused._0_8_ = this;
  *(Instruction **)((long)local_68._M_unused._0_8_ + 8) = access_chain;
  *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)((long)local_68._M_unused._0_8_ + 0x10) =
       &indexes;
  *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)((long)local_68._M_unused._0_8_ + 0x18) =
       interface_var_component_indices;
  *(Instruction **)((long)local_68._M_unused._0_8_ + 0x20) = scalar_var;
  *(unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
    **)((long)local_68._M_unused._0_8_ + 0x28) = loads_to_component_values;
  local_50 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:519:7)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:519:7)>
             ::_M_manager;
  analysis::DefUseManager::ForEachUser
            (this_00,access_chain,(function<void_(spvtools::opt::Instruction_*)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::ReplaceAccessChainWith(
    Instruction* access_chain,
    const std::vector<uint32_t>& interface_var_component_indices,
    Instruction* scalar_var,
    std::unordered_map<Instruction*, Instruction*>* loads_to_component_values) {
  std::vector<uint32_t> indexes;
  for (uint32_t i = 1; i < access_chain->NumInOperands(); ++i) {
    indexes.push_back(access_chain->GetSingleWordInOperand(i));
  }

  // Note that we have a strong assumption that |access_chain| has only a single
  // index that is for the extra arrayness.
  context()->get_def_use_mgr()->ForEachUser(
      access_chain,
      [this, access_chain, &indexes, &interface_var_component_indices,
       scalar_var, loads_to_component_values](Instruction* user) {
        switch (user->opcode()) {
          case spv::Op::OpAccessChain: {
            UseBaseAccessChainForAccessChain(user, access_chain);
            ReplaceAccessChainWith(user, interface_var_component_indices,
                                   scalar_var, loads_to_component_values);
            return;
          }
          case spv::Op::OpStore: {
            uint32_t value_id = user->GetSingleWordInOperand(1);
            StoreComponentOfValueToAccessChainToScalarVar(
                value_id, interface_var_component_indices, scalar_var, indexes,
                user);
            return;
          }
          case spv::Op::OpLoad: {
            Instruction* value =
                LoadAccessChainToVar(scalar_var, indexes, user);
            loads_to_component_values->insert({user, value});
            return;
          }
          default:
            break;
        }
      });
}